

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-parser.cpp
# Opt level: O2

Up __thiscall yactfr::internal::TsdlParser::_tryParseNtStrType(TsdlParser *this)

{
  TsdlAttr *pTVar1;
  bool bVar2;
  TsdlParser *in_RSI;
  TsdlAttr *attr;
  TsdlAttr *this_00;
  _tAttrs attrs;
  TextLocation beginLoc;
  undefined1 local_110 [16];
  TsdlAttr *pTStack_100;
  undefined8 local_f8;
  undefined4 local_e4;
  TextLocation local_e0;
  TsdlAttr local_c8;
  
  StrScanner::skipCommentsAndWhitespaces<true,true>(&in_RSI->_ss);
  StrScanner::loc(&local_e0,&in_RSI->_ss);
  bVar2 = StrScanner::tryScanToken<true,true>(&in_RSI->_ss,"string");
  if (bVar2) {
    bVar2 = StrScanner::tryScanToken<true,true>(&in_RSI->_ss,"{");
    if (bVar2) {
      local_f8 = 0;
      local_110._8_8_ = (TsdlAttr *)0x0;
      pTStack_100 = (TsdlAttr *)0x0;
      while( true ) {
        _skipCommentsAndWhitespacesAndSemicolons(in_RSI);
        bVar2 = StrScanner::tryScanToken<true,true>(&in_RSI->_ss,"}");
        if (bVar2) break;
        _expectAttr(&local_c8,in_RSI);
        std::vector<yactfr::internal::TsdlAttr,_std::allocator<yactfr::internal::TsdlAttr>_>::
        emplace_back<yactfr::internal::TsdlAttr>
                  ((vector<yactfr::internal::TsdlAttr,_std::allocator<yactfr::internal::TsdlAttr>_>
                    *)(local_110 + 8),&local_c8);
        TsdlAttr::~TsdlAttr(&local_c8);
      }
      _checkDupAttr((_tAttrs *)(local_110 + 8));
      pTVar1 = pTStack_100;
      for (this_00 = (TsdlAttr *)local_110._8_8_; this_00 != pTVar1; this_00 = this_00 + 1) {
        bVar2 = std::operator==(&this_00->name,"encoding");
        if (bVar2) {
          TsdlAttr::hasEncoding(this_00);
        }
        else {
          TsdlAttr::throwUnknown(this_00);
        }
      }
      local_e4 = 8;
      std::make_unique<yactfr::NullTerminatedStringType_const,int>((int *)local_110);
      std::
      make_unique<yactfr::internal::PseudoScalarDtWrapper,std::unique_ptr<yactfr::NullTerminatedStringType_const,std::default_delete<yactfr::NullTerminatedStringType_const>>,yactfr::TextLocation_const&>
                ((unique_ptr<const_yactfr::NullTerminatedStringType,_std::default_delete<const_yactfr::NullTerminatedStringType>_>
                  *)&local_c8,(TextLocation *)local_110);
      (this->_ss)._begin = (char *)local_c8._0_8_;
      local_c8.kind = Unset;
      local_c8._4_4_ = 0;
      std::
      unique_ptr<const_yactfr::NullTerminatedStringType,_std::default_delete<const_yactfr::NullTerminatedStringType>_>
      ::~unique_ptr((unique_ptr<const_yactfr::NullTerminatedStringType,_std::default_delete<const_yactfr::NullTerminatedStringType>_>
                     *)local_110);
      std::vector<yactfr::internal::TsdlAttr,_std::allocator<yactfr::internal::TsdlAttr>_>::~vector
                ((vector<yactfr::internal::TsdlAttr,_std::allocator<yactfr::internal::TsdlAttr>_> *)
                 (local_110 + 8));
    }
    else {
      local_110._0_4_ = 8;
      std::make_unique<yactfr::NullTerminatedStringType_const,int>((int *)(local_110 + 8));
      std::
      make_unique<yactfr::internal::PseudoScalarDtWrapper,std::unique_ptr<yactfr::NullTerminatedStringType_const,std::default_delete<yactfr::NullTerminatedStringType_const>>,yactfr::TextLocation_const&>
                ((unique_ptr<const_yactfr::NullTerminatedStringType,_std::default_delete<const_yactfr::NullTerminatedStringType>_>
                  *)&local_c8,(TextLocation *)(local_110 + 8));
      (this->_ss)._begin = (char *)local_c8._0_8_;
      local_c8.kind = Unset;
      local_c8._4_4_ = 0;
      std::
      unique_ptr<const_yactfr::NullTerminatedStringType,_std::default_delete<const_yactfr::NullTerminatedStringType>_>
      ::~unique_ptr((unique_ptr<const_yactfr::NullTerminatedStringType,_std::default_delete<const_yactfr::NullTerminatedStringType>_>
                     *)(local_110 + 8));
    }
  }
  else {
    (this->_ss)._begin = (char *)0x0;
  }
  return (__uniq_ptr_data<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>,_true,_true>
          )(__uniq_ptr_data<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>,_true,_true>
            )this;
}

Assistant:

PseudoDt::Up TsdlParser::_tryParseNtStrType()
{
    _ss.skipCommentsAndWhitespaces();

    const auto beginLoc = _ss.loc();

    // parse `string`
    if (!_ss.tryScanToken("string")) {
        return nullptr;
    }

    // try to parse `{`
    if (!_ss.tryScanToken("{")) {
        return std::make_unique<PseudoScalarDtWrapper>(std::make_unique<const NullTerminatedStringType>(8),
                                                       beginLoc);
    }

    // parse attributes
    _tAttrs attrs;

    while (true) {
        this->_skipCommentsAndWhitespacesAndSemicolons();

        // end of block?
        if (_ss.tryScanToken("}")) {
            break;
        }

        // parse attribute
        attrs.push_back(this->_expectAttr());
    }

    // check for duplicate attributes
    TsdlParser::_checkDupAttr(attrs);

    // check attributes
    for (const auto& attr : attrs) {
        if (attr.name == "encoding") {
            // only used to validate
            attr.hasEncoding();
        } else {
            attr.throwUnknown();
        }
    }

    return std::make_unique<PseudoScalarDtWrapper>(std::make_unique<const NullTerminatedStringType>(8),
                                                   beginLoc);
}